

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

int __thiscall
TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
::ClassId(TPZFrontMatrix<std::complex<float>,_TPZStackEqnStorage<std::complex<float>_>,_TPZFrontNonSym<std::complex<float>_>_>
          *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string sStack_1fb38;
  TPZFrontNonSym<std::complex<float>_> TStack_1fb18;
  TPZStackEqnStorage<std::complex<float>_> TStack_1f9f0;
  
  sStack_1fb38._M_dataplus._M_p = (pointer)&sStack_1fb38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_1fb38,"TPZFrontMatrix","");
  uVar1 = Hash(&sStack_1fb38);
  iVar2 = TPZAbstractFrontMatrix<std::complex<float>_>::ClassId
                    (&this->super_TPZAbstractFrontMatrix<std::complex<float>_>);
  TPZStackEqnStorage<std::complex<float>_>::TPZStackEqnStorage(&TStack_1f9f0);
  iVar3 = TPZStackEqnStorage<std::complex<float>_>::ClassId(&TStack_1f9f0);
  TPZFrontNonSym<std::complex<float>_>::TPZFrontNonSym(&TStack_1fb18);
  iVar4 = TPZFrontNonSym<std::complex<float>_>::ClassId(&TStack_1fb18);
  TPZFrontNonSym<std::complex<float>_>::~TPZFrontNonSym(&TStack_1fb18);
  TPZStackEqnStorage<std::complex<float>_>::~TPZStackEqnStorage(&TStack_1f9f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_1fb38._M_dataplus._M_p != &sStack_1fb38.field_2) {
    operator_delete(sStack_1fb38._M_dataplus._M_p,sStack_1fb38.field_2._M_allocated_capacity + 1);
  }
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}